

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBuffer.c
# Opt level: O3

ZyanStatus ZydisFormatterBufferGetString(ZydisFormatterBuffer *buffer,ZyanString **string)

{
  void *pvVar1;
  ZyanStatus ZVar2;
  
  ZVar2 = 0x80100004;
  if (string != (ZyanString **)0x0 && buffer != (ZydisFormatterBuffer *)0x0) {
    pvVar1 = (buffer->string).vector.data;
    if (buffer->is_token_list == '\0') {
      if (pvVar1 == (void *)0x0) {
        __assert_fail("buffer->string.vector.data",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBuffer.c"
                      ,0x67,
                      "ZyanStatus ZydisFormatterBufferGetString(ZydisFormatterBuffer *, ZyanString **)"
                     );
      }
    }
    else if (*(char *)((long)pvVar1 + -2) == '\0') {
      return 0x80100005;
    }
    if ((buffer->string).vector.size == 0) {
      __assert_fail("buffer->string.vector.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBuffer.c"
                    ,0x68,
                    "ZyanStatus ZydisFormatterBufferGetString(ZydisFormatterBuffer *, ZyanString **)"
                   );
    }
    *string = &buffer->string;
    ZVar2 = 0x100000;
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZydisFormatterBufferGetString(ZydisFormatterBuffer* buffer, ZyanString** string)
{
    if (!buffer || !string)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (buffer->is_token_list &&
        ((ZydisFormatterTokenConst*)buffer->string.vector.data - 1)->type == ZYDIS_TOKEN_INVALID)
    {
        return ZYAN_STATUS_INVALID_OPERATION;
    }

    ZYAN_ASSERT(buffer->string.vector.data);
    ZYAN_ASSERT(buffer->string.vector.size);

    *string = &buffer->string;

    return ZYAN_STATUS_SUCCESS;
}